

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord_rep_btree.cc
# Opt level: O2

string_view __thiscall
absl::cord_internal::CordRepBtree::AddData<(absl::cord_internal::CordRepBtree::EdgeType)1>
          (CordRepBtree *this,string_view data,size_t extra)

{
  byte bVar1;
  CordRep *this_00;
  char *pcVar2;
  size_t in_R8;
  char *dst;
  string_view s;
  
  if (data._M_len == 0) {
    __assert_fail("!data.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/google[P]osqp-cpp/build_O2/_deps/abseil-cpp-src/absl/strings/internal/cord_rep_btree.cc"
                  ,0x23e,
                  "absl::string_view absl::cord_internal::CordRepBtree::AddData(absl::string_view, size_t)"
                 );
  }
  if ((ulong)(this->super_CordRep).storage[2] - (ulong)(this->super_CordRep).storage[1] < 6) {
    AlignBegin(this);
    do {
      dst = (char *)data._M_len;
      this_00 = &CordRepFlat::NewImpl<4096ul>((size_t)(dst + extra))->super_CordRep;
      pcVar2 = (char *)CordRepFlat::Capacity((CordRepFlat *)this_00);
      if (dst <= pcVar2) {
        pcVar2 = dst;
      }
      ((CordRep *)&this_00->length)->length = (size_t)pcVar2;
      bVar1 = (this->super_CordRep).storage[2];
      (this->super_CordRep).storage[2] = bVar1 + 1;
      this->edges_[bVar1] = this_00;
      s._M_str = pcVar2;
      s._M_len = (size_t)data._M_str;
      data = anon_unknown_0::Consume<(absl::cord_internal::CordRepBtree::EdgeType)1>
                       ((anon_unknown_0 *)this_00->storage,dst,s,in_R8);
    } while ((data._M_len != 0) && ((this->super_CordRep).storage[2] != '\x06'));
    return data;
  }
  __assert_fail("size() < capacity()",
                "/workspace/llm4binary/github/license_c_cmakelists/google[P]osqp-cpp/build_O2/_deps/abseil-cpp-src/absl/strings/internal/cord_rep_btree.cc"
                ,0x23f,
                "absl::string_view absl::cord_internal::CordRepBtree::AddData(absl::string_view, size_t)"
               );
}

Assistant:

inline bool owned(int depth) const { return depth < share_depth; }